

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.h
# Opt level: O2

fio_str_info_s *
fio_str_concat(fio_str_info_s *__return_storage_ptr__,fio_str_s *dest,fio_str_s *src)

{
  byte bVar1;
  ulong uVar2;
  uint64_t needed;
  uint8_t *puVar3;
  fio_str_info_s src_state;
  fio_str_info_s local_50;
  fio_str_info_s local_38;
  
  if (((src == (fio_str_s *)0x0 || dest == (fio_str_s *)0x0) || (dest->frozen != '\0')) ||
     (fio_str_info(&local_50,src), local_50.len == 0)) {
    fio_str_info(__return_storage_ptr__,dest);
    return __return_storage_ptr__;
  }
  bVar1 = dest->small;
  if ((bVar1 == 0) && (dest->data != (char *)0x0)) {
    if (dest->frozen == '\0') {
      needed = dest->len + local_50.len;
LAB_001381a1:
      uVar2 = dest->capa;
      if (uVar2 <= needed) {
        if (dest->dealloc == (_func_void_void_ptr *)0x0) {
          uVar2 = dest->len;
        }
        dest->len = uVar2;
LAB_001381b9:
        fio_str_capa_assert(&local_38,dest,needed);
      }
      dest->len = needed;
      dest->data[needed] = '\0';
      __return_storage_ptr__->capa = dest->capa;
      __return_storage_ptr__->len = needed;
      puVar3 = (uint8_t *)dest->data;
LAB_001381e5:
      __return_storage_ptr__->data = (char *)puVar3;
      goto LAB_001381e9;
    }
  }
  else if (dest->frozen == '\0') {
    needed = (bVar1 >> 1) + local_50.len;
    if ((bVar1 == 0) && (dest->data != (char *)0x0)) goto LAB_001381a1;
    if (0x29 < needed) {
      dest->small = 'S';
      goto LAB_001381b9;
    }
    dest->small = (char)needed * '\x02' + '\x01';
    dest->reserved[needed] = '\0';
    puVar3 = dest->reserved;
    __return_storage_ptr__->capa = 0x29;
    __return_storage_ptr__->len = needed;
    goto LAB_001381e5;
  }
  fio_str_info(__return_storage_ptr__,dest);
  needed = __return_storage_ptr__->len;
  puVar3 = (uint8_t *)__return_storage_ptr__->data;
LAB_001381e9:
  memcpy(puVar3 + (needed - local_50.len),local_50.data,local_50.len);
  return __return_storage_ptr__;
}

Assistant:

inline FIO_FUNC fio_str_info_s fio_str_concat(fio_str_s *dest,
                                              fio_str_s const *src) {
  if (!dest || !src || dest->frozen)
    return fio_str_info(dest);
  fio_str_info_s src_state = fio_str_info(src);
  if (!src_state.len)
    return fio_str_info(dest);
  fio_str_info_s state =
      fio_str_resize(dest, src_state.len + fio_str_len(dest));
  memcpy(state.data + state.len - src_state.len, src_state.data, src_state.len);
  return state;
}